

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

QString * __thiscall
QSQLiteDriver::stripDelimiters
          (QString *__return_storage_ptr__,QSQLiteDriver *this,QString *identifier,
          IdentifierType type)

{
  char16_t *pcVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  qsizetype qVar5;
  char16_t *pcVar6;
  QSQLiteDriverPrivate *this_00;
  long lVar7;
  long in_FS_OFFSET;
  QStringView identifier_00;
  QStringView identifier_01;
  QStringView local_70;
  QStringView local_60;
  QStringBuilder<QStringBuilder<QStringView_&,_char16_t>,_QStringView_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSQLiteDriverPrivate *)identifier;
  qVar5 = QString::indexOf(identifier,(QChar)0x2e,0,CaseSensitive);
  if (-1 < qVar5) {
    pcVar1 = (identifier->d).ptr;
    lVar7 = (identifier->d).size - (qVar5 + 1);
    pcVar6 = pcVar1 + qVar5 + 1;
    identifier_00.m_data = pcVar1;
    identifier_00.m_size = qVar5;
    local_70.m_size = lVar7;
    local_70.m_data = pcVar6;
    local_60.m_size = qVar5;
    local_60.m_data = pcVar1;
    bVar2 = QSQLiteDriverPrivate::isIdentifierEscaped(this_00,identifier_00);
    identifier_01.m_data = pcVar6;
    identifier_01.m_size = lVar7;
    bVar3 = QSQLiteDriverPrivate::isIdentifierEscaped(this_00,identifier_01);
    if (bVar2 || bVar3) {
      if (bVar2) {
        local_60.m_data = pcVar1 + 1;
        local_60.m_size = qVar5 + -2;
      }
      if (bVar3) {
        local_70.m_data = pcVar6 + 1;
        local_70.m_size = lVar7 + -2;
      }
      local_50.a.a = &local_60;
      local_50.a.b = L'.';
      local_50.b = &local_70;
      QStringBuilder<QStringBuilder<QStringView_&,_char16_t>,_QStringView_&>::convertTo<QString>
                (__return_storage_ptr__,&local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      goto LAB_0011511f;
    }
  }
  cVar4 = (**(code **)(*(long *)this + 0xf0))(this,identifier,type);
  if (cVar4 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&identifier->d);
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QString::mid((longlong)__return_storage_ptr__,(longlong)identifier);
    return __return_storage_ptr__;
  }
LAB_0011511f:
  __stack_chk_fail();
}

Assistant:

QString QSQLiteDriver::stripDelimiters(const QString &identifier, IdentifierType type) const
{
    Q_D(const QSQLiteDriver);
    const auto indexOfSeparator = identifier.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{identifier}.first(indexOfSeparator);
        auto rightName = QStringView{identifier}.sliced(indexOfSeparator + 1);
        const auto leftEscaped = d->isIdentifierEscaped(leftName);
        const auto rightEscaped = d->isIdentifierEscaped(rightName);
        if (leftEscaped || rightEscaped) {
            if (leftEscaped)
                leftName = leftName.sliced(1).chopped(1);
            if (rightEscaped)
                rightName = rightName.sliced(1).chopped(1);
            return leftName + u'.' + rightName;
        }
    }

    if (isIdentifierEscaped(identifier, type))
        return identifier.mid(1, identifier.size() - 2);

    return identifier;
}